

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O1

void __thiscall
QtPromisePrivate::PromiseData<QList<int>>::resolve<QList<int>>
          (PromiseData<QList<int>> *this,QList<int> *value)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 *puVar1;
  QList<int> *__tmp;
  
  puVar1 = (undefined8 *)operator_new(0x28);
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_0012b920;
  puVar1[2] = (value->d).d;
  puVar1[3] = (value->d).ptr;
  puVar1[4] = (value->d).size;
  (value->d).d = (Data *)0x0;
  (value->d).ptr = (int *)0x0;
  (value->d).size = 0;
  *(undefined8 **)(this + 0x58) = puVar1 + 2;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x60);
  *(undefined8 **)(this + 0x60) = puVar1;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  PromiseDataBase<QList<int>,_void_(const_QList<int>_&)>::setSettled
            ((PromiseDataBase<QList<int>,_void_(const_QList<int>_&)> *)this);
  return;
}

Assistant:

void resolve(V&& value)
    {
        Q_ASSERT(this->isPending());
        Q_ASSERT(m_value.isNull());
        m_value = PromiseValue<T>{std::forward<V>(value)};
        this->setSettled();
    }